

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

void __thiscall
Js::JavascriptPromiseAnyRejectElementFunction::JavascriptPromiseAnyRejectElementFunction
          (JavascriptPromiseAnyRejectElementFunction *this,DynamicType *type)

{
  RuntimeFunction::RuntimeFunction
            ((RuntimeFunction *)this,type,
             (FunctionInfo *)JavascriptPromise::EntryInfo::AllResolveElementFunction);
  (this->super_JavascriptPromiseAllResolveElementFunction).capabilities.ptr =
       (JavascriptPromiseCapability *)0x0;
  (this->super_JavascriptPromiseAllResolveElementFunction).index = 0;
  (this->super_JavascriptPromiseAllResolveElementFunction).remainingElementsWrapper.ptr =
       (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)0x0;
  (this->super_JavascriptPromiseAllResolveElementFunction).values.ptr = (JavascriptArray *)0x0;
  (this->super_JavascriptPromiseAllResolveElementFunction).alreadyCalled = false;
  (this->super_JavascriptPromiseAllResolveElementFunction).super_RuntimeFunction.
  super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject = (IRecyclerVisitedObject)&PTR_Finalize_01544380;
  (this->alreadyCalledWrapper).ptr =
       (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)0x0;
  return;
}

Assistant:

JavascriptPromiseAnyRejectElementFunction::JavascriptPromiseAnyRejectElementFunction(DynamicType* type)
        : JavascriptPromiseAllResolveElementFunction(type), alreadyCalledWrapper(nullptr)
    { }